

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O2

shared_ptr<gmlc::networking::TcpServer> __thiscall
helics::apps::AsioBrokerServer::loadTCPserver(AsioBrokerServer *this,io_context *ioctx)

{
  bool bVar1;
  int iVar2;
  const_reference element;
  io_context *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gmlc::networking::TcpServer> sVar3;
  allocator<char> local_65;
  int tcpport;
  string local_60;
  string ext_interface;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ext_interface,"0.0.0.0",(allocator<char> *)&local_60);
  iVar2 = getDefaultPort(6);
  tcpport = iVar2;
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[4],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)ioctx[8].impl_,(char (*) [4])"tcp");
  if (bVar1) {
    element = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)ioctx[8].impl_,"tcp");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"interface",&local_65);
    fileops::replaceIfMember(element,&local_60,(string *)&ext_interface);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"port",&local_65);
    fileops::replaceIfMember(element,&local_60,&tcpport);
    std::__cxx11::string::~string((string *)&local_60);
    iVar2 = tcpport;
  }
  gmlc::networking::TcpServer::create
            ((TcpServer *)this,in_RDX,&ext_interface,(uint16_t)iVar2,true,0x800);
  std::__cxx11::string::~string((string *)&ext_interface);
  sVar3.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<gmlc::networking::TcpServer>)
         sVar3.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<gmlc::networking::TcpServer>
        AsioBrokerServer::loadTCPserver(asio::io_context& ioctx)
    {
        std::string ext_interface = "0.0.0.0";
        int tcpport = getDefaultPort(HELICS_CORE_TYPE_TCP);
        // std::chrono::milliseconds timeout(20000);
        if (config_->contains("tcp")) {
            const auto& V = (*config_)["tcp"];
            helics::fileops::replaceIfMember(V, "interface", ext_interface);
            helics::fileops::replaceIfMember(V, "port", tcpport);
        }
        auto server = gmlc::networking::TcpServer::create(
            ioctx, ext_interface, static_cast<uint16_t>(tcpport), true, 2048);
        return server;
    }